

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_net_reader.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ostream *poVar2;
  Reader *__p;
  vector<char,_std::allocator<char>_> line;
  shared_ptr<diffusion::Reader> net_reader;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  long *local_40 [2];
  string local_30;
  
  if (argc < 3) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," writer_ip_address writer_port");
    std::endl<char,std::char_traits<char>>(poVar2);
    return 0;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,argv[1],&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,argv[2],&local_62);
  __p = diffusion::create_network_reader(&local_60,&local_30);
  std::__shared_ptr<diffusion::Reader,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<diffusion::Reader,void>
            ((__shared_ptr<diffusion::Reader,(__gnu_cxx::_Lock_policy)2> *)local_40,__p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_60);
  do {
    while( true ) {
      cVar1 = (**(code **)*local_40[0])();
      if (cVar1 == '\0') break;
      (**(code **)(*local_40[0] + 8))(&local_60);
      std::ostream::write((char *)&std::cout,(long)local_60._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&local_60);
    }
    local_60._M_dataplus._M_p = (pointer)0xa;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&local_60);
  } while( true );
}

Assistant:

int main(int argc, char * argv[]) {
    if (argc < 3) {
        std::cerr << "Usage: " << argv[0] << " writer_ip_address writer_port" << std::endl;
        return 0;
    }
    auto net_reader = std::shared_ptr<diffusion::Reader>(diffusion::create_network_reader(argv[1], argv[2]));
    while (true) {
        if (net_reader->can_read()) {
            auto line = net_reader->read();
            std::cout.write(line.data(), line.size());
            std::cout << std::endl;
        } else {
            std::this_thread::sleep_for(std::chrono::milliseconds(10));
        }
    }
    return 0;
}